

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O1

bool __thiscall choc::value::Type::Object::operator==(Object *this,Object *other)

{
  size_t *psVar1;
  MainType MVar2;
  MemberNameAndType *pMVar3;
  int iVar4;
  size_t sVar5;
  uint uVar6;
  MemberNameAndType *pMVar7;
  MemberNameAndType *pMVar8;
  bool bVar9;
  bool bVar10;
  long local_38;
  
  sVar5 = (this->className)._M_len;
  if ((sVar5 == (other->className)._M_len) &&
     (((sVar5 == 0 ||
       (iVar4 = bcmp((this->className)._M_str,(other->className)._M_str,sVar5), iVar4 == 0)) &&
      ((this->members).size == (other->members).size)))) {
    bVar9 = (this->members).size == 0;
    if (!bVar9) {
      pMVar8 = (this->members).items;
      sVar5 = (pMVar8->name)._M_len;
      pMVar7 = (other->members).items;
      if (sVar5 == (pMVar7->name)._M_len) {
        uVar6 = 0;
        local_38 = 0x30;
        do {
          if ((sVar5 != 0) &&
             (iVar4 = bcmp((pMVar8->name)._M_str,(pMVar7->name)._M_str,sVar5), iVar4 != 0)) {
            return bVar9;
          }
          MVar2 = (pMVar8->type).mainType;
          if (MVar2 != (pMVar7->type).mainType) {
            return bVar9;
          }
          if (MVar2 < complexArray) {
            if (MVar2 == vector) {
              bVar10 = (pMVar8->type).content.vector.numElements ==
                       (pMVar7->type).content.vector.numElements &&
                       (pMVar8->type).content.vector.elementType ==
                       (pMVar7->type).content.vector.elementType;
              goto LAB_001cf922;
            }
            if (MVar2 == primitiveArray) {
              if ((pMVar8->type).content.vector.elementType !=
                  (pMVar7->type).content.vector.elementType) {
                return bVar9;
              }
              if ((pMVar8->type).content.vector.numElements !=
                  (pMVar7->type).content.vector.numElements) {
                return bVar9;
              }
              bVar10 = (pMVar8->type).content.primitiveArray.numVectorElements ==
                       (pMVar7->type).content.primitiveArray.numVectorElements;
              goto LAB_001cf922;
            }
          }
          else {
            if (MVar2 == complexArray) {
              bVar10 = AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::operator==
                                 ((AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *
                                  )(pMVar8->type).content.object,
                                  (AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *
                                  )(pMVar7->type).content.object);
            }
            else {
              if (MVar2 != object) goto LAB_001cf926;
              bVar10 = operator==((pMVar8->type).content.object,(pMVar7->type).content.object);
            }
LAB_001cf922:
            if (bVar10 == false) {
              return bVar9;
            }
          }
LAB_001cf926:
          uVar6 = uVar6 + 1;
          bVar9 = (this->members).size <= uVar6;
          if (bVar9) {
            return bVar9;
          }
          pMVar8 = (this->members).items;
          sVar5 = *(size_t *)((long)&(pMVar8->name)._M_len + local_38);
          pMVar8 = pMVar8 + uVar6;
          pMVar3 = (other->members).items;
          pMVar7 = pMVar3 + uVar6;
          psVar1 = (size_t *)((long)&(pMVar3->name)._M_len + local_38);
          local_38 = local_38 + 0x30;
        } while (sVar5 == *psVar1);
      }
    }
  }
  else {
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

bool operator== (const Object& other) const
    {
        if (className != other.className)
            return false;

        if (members.size != other.members.size)
            return false;

        for (uint32_t i = 0; i < members.size; ++i)
            if (members[i].name != other.members[i].name
                    || members[i].type != other.members[i].type)
                return false;

        return true;
    }